

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

StructDef * __thiscall
flatbuffers::Parser::LookupStructThruParentNamespaces(Parser *this,string *id)

{
  StructDef *pSVar1;
  StructDef *sd;
  string *id_local;
  Parser *this_local;
  
  pSVar1 = anon_unknown_0::LookupTableByName<flatbuffers::StructDef>
                     (&this->structs_,id,this->current_namespace_,1);
  if (pSVar1 != (StructDef *)0x0) {
    (pSVar1->super_Definition).refcount = (pSVar1->super_Definition).refcount + 1;
  }
  return pSVar1;
}

Assistant:

StructDef *Parser::LookupStructThruParentNamespaces(
    const std::string &id) const {
  auto sd = LookupTableByName(structs_, id, *current_namespace_, 1);
  if (sd) sd->refcount++;
  return sd;
}